

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

double BeliefValue::GetValue
                 (BeliefInterface *Belief,ValueFunctionPOMDPDiscrete *V,
                 vector<bool,_std::allocator<bool>_> *mask)

{
  const_reference cVar1;
  char *arg;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference this;
  vector<double,_std::allocator<double>_> *pvVar6;
  vector<bool,_std::allocator<bool>_> *in_RDX;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  long *in_RDI;
  double dVar7;
  uint i;
  bool maskValid;
  double maxVal;
  double x;
  vector<bool,_std::allocator<bool>_> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffc4;
  uint7 in_stack_ffffffffffffffd0;
  double local_28;
  
  local_28 = -1.79769313486232e+308;
  this_00 = in_RDX;
  arg = (char *)std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)(ulong)in_stack_ffffffffffffffd0);
  pcVar2 = (char *)std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI);
  if (arg == pcVar2) {
    for (uVar8 = 0; uVar4 = (ulong)uVar8,
        sVar5 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI), uVar4 != sVar5
        ; uVar8 = uVar8 + 1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)in_RDX);
      if (cVar1) {
        this = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                         (in_RSI,(ulong)uVar8);
        pvVar6 = AlphaVector::GetValues(this);
        dVar7 = (double)(**(code **)(*in_RDI + 0x80))(in_RDI,pvVar6);
        if (local_28 < dVar7) {
          local_28 = dVar7;
        }
      }
    }
    return local_28;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),arg);
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

double BeliefValue::GetValue(const BeliefInterface &Belief,
                             const ValueFunctionPOMDPDiscrete &V,
                             const vector<bool> mask)
{
    double x,maxVal=-DBL_MAX;
    bool maskValid=false;

    if(mask.size()!=V.size())
    {
        throw(E("BeliefValue::GetValue: mask has incorrect size"));
    }

    for(unsigned int i=0;i!=V.size();i++)
    {
        if(mask[i])
        {
            maskValid=true;
            // compute inner product of belief with vector
            x=Belief.InnerProduct(V[i].GetValues());
        
            // keep the maximizing value
            if(x>maxVal)
                maxVal=x;
        }
    }

    return(maxVal);
}